

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_search.c
# Opt level: O0

ares_status_t ares_lookup_hostaliases(ares_channel_t *channel,char *name,char **alias)

{
  ares_buf_t *buf_00;
  ares_status_t aVar1;
  ares_bool_t aVar2;
  char *pcVar3;
  ares_buf_t **ppaVar4;
  undefined8 *puVar5;
  size_t sVar6;
  char local_1a8 [8];
  char fqdn [256];
  char hostname [64];
  ares_buf_t *line;
  ares_buf_t **bufptr;
  size_t i;
  size_t num;
  ares_array_t *lines;
  ares_buf_t *buf;
  char *hostaliases;
  char **ppcStack_28;
  ares_status_t status;
  char **alias_local;
  char *name_local;
  ares_channel_t *channel_local;
  
  hostaliases._4_4_ = 0;
  buf = (ares_buf_t *)0x0;
  lines = (ares_array_t *)0x0;
  num = 0;
  if (((channel == (ares_channel_t *)0x0) || (name == (char *)0x0)) || (alias == (char **)0x0)) {
    channel_local._4_4_ = ARES_EFORMERR;
  }
  else {
    *alias = (char *)0x0;
    if ((channel->flags & 0x40) == 0) {
      ppcStack_28 = alias;
      alias_local = (char **)name;
      name_local = (char *)channel;
      pcVar3 = strchr(name,0x2e);
      if (pcVar3 == (char *)0x0) {
        buf = (ares_buf_t *)getenv("HOSTALIASES");
        if (buf == (ares_buf_t *)0x0) {
          hostaliases._4_4_ = ARES_ENOTFOUND;
        }
        else {
          lines = (ares_array_t *)ares_buf_create();
          if ((ares_buf_t *)lines == (ares_buf_t *)0x0) {
            hostaliases._4_4_ = ARES_ENOMEM;
          }
          else {
            hostaliases._4_4_ = ares_buf_load_file((char *)buf,(ares_buf_t *)lines);
            if ((hostaliases._4_4_ == ARES_SUCCESS) &&
               (hostaliases._4_4_ =
                     ares_buf_split((ares_buf_t *)lines,(uchar *)"\n",1,ARES_BUF_SPLIT_TRIM,0,
                                    (ares_array_t **)&num), hostaliases._4_4_ == ARES_SUCCESS)) {
              ppaVar4 = (ares_buf_t **)ares_array_len((ares_array_t *)num);
              for (bufptr = (ares_buf_t **)0x0; bufptr < ppaVar4;
                  bufptr = (ares_buf_t **)((long)bufptr + 1)) {
                puVar5 = (undefined8 *)ares_array_at((ares_array_t *)num,(size_t)bufptr);
                buf_00 = (ares_buf_t *)*puVar5;
                memset(fqdn + 0xf8,0,0x40);
                memset(local_1a8,0,0x100);
                ares_buf_tag(buf_00);
                ares_buf_consume_nonwhitespace(buf_00);
                aVar1 = ares_buf_tag_fetch_string(buf_00,fqdn + 0xf8,0x40);
                if ((aVar1 == ARES_SUCCESS) &&
                   (aVar2 = ares_strcaseeq(fqdn + 0xf8,(char *)alias_local), aVar2 != ARES_FALSE)) {
                  ares_buf_consume_whitespace(buf_00,ARES_TRUE);
                  ares_buf_tag(buf_00);
                  ares_buf_consume_nonwhitespace(buf_00);
                  aVar1 = ares_buf_tag_fetch_string(buf_00,local_1a8,0x100);
                  if ((aVar1 == ARES_SUCCESS) &&
                     ((sVar6 = ares_strlen(local_1a8), sVar6 != 0 &&
                      (aVar2 = ares_is_hostname(local_1a8), aVar2 != ARES_FALSE)))) {
                    pcVar3 = ares_strdup(local_1a8);
                    *ppcStack_28 = pcVar3;
                    if (*ppcStack_28 == (char *)0x0) {
                      hostaliases._4_4_ = ARES_ENOMEM;
                    }
                    else {
                      hostaliases._4_4_ = ARES_SUCCESS;
                    }
                    goto LAB_0011a812;
                  }
                }
              }
              hostaliases._4_4_ = ARES_ENOTFOUND;
            }
          }
        }
LAB_0011a812:
        ares_buf_destroy((ares_buf_t *)lines);
        ares_array_destroy((ares_array_t *)num);
        channel_local._4_4_ = hostaliases._4_4_;
      }
      else {
        channel_local._4_4_ = ARES_ENOTFOUND;
      }
    }
    else {
      channel_local._4_4_ = ARES_ENOTFOUND;
    }
  }
  return channel_local._4_4_;
}

Assistant:

ares_status_t ares_lookup_hostaliases(const ares_channel_t *channel,
                                      const char *name, char **alias)
{
  ares_status_t status      = ARES_SUCCESS;
  const char   *hostaliases = NULL;
  ares_buf_t   *buf         = NULL;
  ares_array_t *lines       = NULL;
  size_t        num;
  size_t        i;

  if (channel == NULL || name == NULL || alias == NULL) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  *alias = NULL;

  /* Configuration says to not perform alias lookup */
  if (channel->flags & ARES_FLAG_NOALIASES) {
    return ARES_ENOTFOUND;
  }

  /* If a domain has a '.', its not allowed to perform an alias lookup */
  if (strchr(name, '.') != NULL) {
    return ARES_ENOTFOUND;
  }

  hostaliases = getenv("HOSTALIASES");
  if (hostaliases == NULL) {
    status = ARES_ENOTFOUND;
    goto done;
  }

  buf = ares_buf_create();
  if (buf == NULL) {
    status = ARES_ENOMEM; /* LCOV_EXCL_LINE: OutOfMemory */
    goto done;            /* LCOV_EXCL_LINE: OutOfMemory */
  }

  status = ares_buf_load_file(hostaliases, buf);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* The HOSTALIASES file is structured as one alias per line.  The first
   * field in the line is the simple hostname with no periods, followed by
   * whitespace, then the full domain name, e.g.:
   *
   * c-ares  www.c-ares.org
   * curl    www.curl.se
   */

  status = ares_buf_split(buf, (const unsigned char *)"\n", 1,
                          ARES_BUF_SPLIT_TRIM, 0, &lines);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  num = ares_array_len(lines);
  for (i = 0; i < num; i++) {
    ares_buf_t **bufptr       = ares_array_at(lines, i);
    ares_buf_t  *line         = *bufptr;
    char         hostname[64] = "";
    char         fqdn[256]    = "";

    /* Pull off hostname */
    ares_buf_tag(line);
    ares_buf_consume_nonwhitespace(line);
    if (ares_buf_tag_fetch_string(line, hostname, sizeof(hostname)) !=
        ARES_SUCCESS) {
      continue;
    }

    /* Match hostname */
    if (!ares_strcaseeq(hostname, name)) {
      continue;
    }

    /* consume whitespace */
    ares_buf_consume_whitespace(line, ARES_TRUE);

    /* pull off fqdn */
    ares_buf_tag(line);
    ares_buf_consume_nonwhitespace(line);
    if (ares_buf_tag_fetch_string(line, fqdn, sizeof(fqdn)) != ARES_SUCCESS ||
        ares_strlen(fqdn) == 0) {
      continue;
    }

    /* Validate characterset */
    if (!ares_is_hostname(fqdn)) {
      continue;
    }

    *alias = ares_strdup(fqdn);
    if (*alias == NULL) {
      status = ARES_ENOMEM; /* LCOV_EXCL_LINE: OutOfMemory */
      goto done;            /* LCOV_EXCL_LINE: OutOfMemory */
    }

    /* Good! */
    status = ARES_SUCCESS;
    goto done;
  }

  status = ARES_ENOTFOUND;

done:
  ares_buf_destroy(buf);
  ares_array_destroy(lines);

  return status;
}